

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O3

void ra_remove_at_index(roaring_array_t *ra,int32_t i)

{
  uint uVar1;
  
  uVar1 = ~i;
  memmove(ra->containers + i,ra->containers + (long)i + 1,(long)(int)(ra->size + uVar1) << 3);
  memmove(ra->keys + i,ra->keys + (long)i + 1,(long)(int)(ra->size + uVar1) * 2);
  memmove(ra->typecodes + i,ra->typecodes + (long)i + 1,(long)(int)(uVar1 + ra->size));
  ra->size = ra->size + -1;
  return;
}

Assistant:

void ra_remove_at_index(roaring_array_t *ra, int32_t i) {
    memmove(&(ra->containers[i]), &(ra->containers[i + 1]),
            sizeof(container_t *) * (ra->size - i - 1));
    memmove(&(ra->keys[i]), &(ra->keys[i + 1]),
            sizeof(uint16_t) * (ra->size - i - 1));
    memmove(&(ra->typecodes[i]), &(ra->typecodes[i + 1]),
            sizeof(uint8_t) * (ra->size - i - 1));
    ra->size--;
}